

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

bool __thiscall
vkt::texture::SampleVerifier::verifySampleMipmapLevel
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,Vec4 *coord,Vec2 *lodBounds,
          int level,ostream *report)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  const_reference pvVar4;
  IVec3 *pIVar5;
  ostream *poVar6;
  int *piVar7;
  int *piVar8;
  double *local_188;
  Vector<int,_3> *local_170;
  Vector<float,_3> *local_158;
  Vector<float,_3> *local_140;
  deInt32 *comp;
  int local_120;
  int compNdx;
  int levelNdx;
  bool carry;
  IVec3 gridCoord [2];
  undefined1 auStack_f8 [7];
  bool done;
  int local_f0;
  Vector<float,_3> local_ec;
  undefined1 local_e0 [8];
  FloatFormat coordFormat;
  IVec3 gridCoordMax [2];
  undefined1 local_98 [8];
  IVec3 gridCoordMin [2];
  undefined1 local_78 [8];
  Vec3 unnormalizedCoordMax [2];
  undefined1 local_58 [8];
  Vec3 unnormalizedCoordMin [2];
  VkSamplerMipmapMode mipmapFilter;
  int level_local;
  Vec2 *lodBounds_local;
  Vec4 *coord_local;
  Vec4 *result_local;
  SampleArguments *args_local;
  SampleVerifier *this_local;
  
  unnormalizedCoordMin[1].m_data[1] = (float)this->m_samplerParams->mipmapFilter;
  if (level == this->m_imParams->levels + -1) {
    unnormalizedCoordMin[1].m_data[1] = 0.0;
  }
  local_140 = (Vector<float,_3> *)local_58;
  unnormalizedCoordMin[1].m_data[2] = (float)level;
  do {
    tcu::Vector<float,_3>::Vector(local_140);
    local_140 = local_140 + 1;
  } while (local_140 != (Vector<float,_3> *)(unnormalizedCoordMin[1].m_data + 1));
  local_158 = (Vector<float,_3> *)local_78;
  do {
    tcu::Vector<float,_3>::Vector(local_158);
    local_158 = local_158 + 1;
  } while (local_158 != (Vector<float,_3> *)(unnormalizedCoordMax[1].m_data + 1));
  local_170 = (Vector<int,_3> *)local_98;
  do {
    tcu::Vector<int,_3>::Vector(local_170);
    local_170 = local_170 + 1;
  } while (local_170 != (Vector<int,_3> *)(gridCoordMin[1].m_data + 1));
  local_188 = &coordFormat.m_maxValue;
  do {
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_188);
    local_188 = (double *)((long)local_188 + 0xc);
  } while (local_188 != (double *)(gridCoordMax[1].m_data + 1));
  tcu::FloatFormat::FloatFormat((FloatFormat *)local_e0,-0x20,0x20,0x10,true,MAYBE,MAYBE,MAYBE);
  pvVar4 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
           operator[](this->m_levels,(long)(int)unnormalizedCoordMin[1].m_data[2]);
  pIVar5 = tcu::ConstPixelBufferAccess::getSize(pvVar4);
  util::calcUnnormalizedCoordRange
            (coord,pIVar5,(FloatFormat *)local_e0,(Vec3 *)local_58,(Vec3 *)local_78);
  util::calcTexelGridCoordRange
            ((Vec3 *)local_58,(Vec3 *)local_78,this->m_coordBits,(IVec3 *)local_98,
             (IVec3 *)&coordFormat.m_maxValue);
  poVar6 = std::operator<<(report,"Level ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)unnormalizedCoordMin[1].m_data[2]);
  poVar6 = std::operator<<(poVar6," computed unnormalized coordinate range: [");
  poVar6 = tcu::operator<<(poVar6,(Vector<float,_3> *)local_58);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = tcu::operator<<(poVar6,(Vector<float,_3> *)local_78);
  std::operator<<(poVar6,"]\n");
  poVar6 = std::operator<<(report,"Level ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)unnormalizedCoordMin[1].m_data[2]);
  poVar6 = std::operator<<(poVar6," computed texel grid coordinate range: [");
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_3> *)local_98);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = tcu::operator<<(poVar6,(Vector<int,_3> *)&coordFormat.m_maxValue);
  std::operator<<(poVar6,"]\n");
  if (unnormalizedCoordMin[1].m_data[1] == 1.4013e-45) {
    pvVar4 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ::operator[](this->m_levels,(long)((int)unnormalizedCoordMin[1].m_data[2] + 1));
    pIVar5 = tcu::ConstPixelBufferAccess::getSize(pvVar4);
    util::calcUnnormalizedCoordRange
              (coord,pIVar5,(FloatFormat *)local_e0,(Vec3 *)(unnormalizedCoordMin[0].m_data + 1),
               (Vec3 *)(unnormalizedCoordMax[0].m_data + 1));
    util::calcTexelGridCoordRange
              ((Vec3 *)(unnormalizedCoordMin[0].m_data + 1),
               (Vec3 *)(unnormalizedCoordMax[0].m_data + 1),this->m_coordBits,
               (IVec3 *)(gridCoordMin[0].m_data + 1),(IVec3 *)(gridCoordMax[0].m_data + 1));
    poVar6 = std::operator<<(report,"Level ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)unnormalizedCoordMin[1].m_data[2] + 1);
    poVar6 = std::operator<<(poVar6," computed unnormalized coordinate range: [");
    poVar6 = tcu::operator<<(poVar6,(Vector<float,_3> *)(unnormalizedCoordMin[0].m_data + 1));
    poVar6 = std::operator<<(poVar6," - ");
    poVar6 = tcu::operator<<(poVar6,(Vector<float,_3> *)(unnormalizedCoordMax[0].m_data + 1));
    std::operator<<(poVar6,"]\n");
    poVar6 = std::operator<<(report,"Level ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)unnormalizedCoordMin[1].m_data[2] + 1);
    poVar6 = std::operator<<(poVar6," computed texel grid coordinate range: [");
    poVar6 = tcu::operator<<(poVar6,(Vector<int,_3> *)(gridCoordMin[0].m_data + 1));
    poVar6 = std::operator<<(poVar6," - ");
    poVar6 = tcu::operator<<(poVar6,(Vector<int,_3> *)(gridCoordMax[0].m_data + 1));
    std::operator<<(poVar6,"]\n");
  }
  else {
    tcu::Vector<float,_3>::Vector(&local_ec,0.0);
    unnormalizedCoordMax[0].m_data[1] = local_ec.m_data[0];
    unnormalizedCoordMax[0].m_data[2] = local_ec.m_data[1];
    unnormalizedCoordMax[1].m_data[0] = local_ec.m_data[2];
    unnormalizedCoordMin[0].m_data[1] = local_ec.m_data[0];
    unnormalizedCoordMin[0].m_data[2] = local_ec.m_data[1];
    unnormalizedCoordMin[1].m_data[0] = local_ec.m_data[2];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_f8,0);
    gridCoordMax[0].m_data[1] = auStack_f8._0_4_;
    gridCoordMax[0].m_data[2] = stack0xffffffffffffff0c;
    gridCoordMax[1].m_data[0] = local_f0;
    gridCoordMin[0].m_data[1] = auStack_f8._0_4_;
    gridCoordMin[0].m_data[2] = stack0xffffffffffffff0c;
    gridCoordMin[1].m_data[0] = local_f0;
  }
  gridCoord[1].m_data[2]._3_1_ = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&levelNdx,(Vector<int,_3> *)local_98);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(gridCoord[0].m_data + 1),
             (Vector<int,_3> *)(gridCoordMin[0].m_data + 1));
  bVar2 = gridCoord[1].m_data[2]._3_1_;
  while( true ) {
    gridCoord[1].m_data[2]._3_1_ = bVar2;
    if (((gridCoord[1].m_data[2]._3_1_ ^ 0xff) & 1) == 0) {
      return false;
    }
    bVar3 = verifySampleTexelGridCoords
                      (this,args,result,(IVec3 *)&levelNdx,(IVec3 *)(gridCoord[0].m_data + 1),
                       lodBounds,(int)unnormalizedCoordMin[1].m_data[2],
                       (VkSamplerMipmapMode)unnormalizedCoordMin[1].m_data[1],report);
    if (bVar3) break;
    bVar2 = 1;
    for (local_120 = 0; local_120 < 2; local_120 = local_120 + 1) {
      for (comp._4_4_ = 0; comp._4_4_ < 3; comp._4_4_ = comp._4_4_ + 1) {
        if (bVar2 != 0) {
          piVar7 = tcu::Vector<int,_3>::operator[]
                             ((Vector<int,_3> *)(&levelNdx + (long)local_120 * 3),comp._4_4_);
          *piVar7 = *piVar7 + 1;
          iVar1 = *piVar7;
          piVar8 = tcu::Vector<int,_3>::operator[]
                             ((Vector<int,_3> *)(gridCoordMax[(long)local_120 + -1].m_data + 1),
                              comp._4_4_);
          if (*piVar8 < iVar1) {
            piVar8 = tcu::Vector<int,_3>::operator[]
                               ((Vector<int,_3> *)(gridCoordMin[(long)local_120 + -1].m_data + 1),
                                comp._4_4_);
            *piVar7 = *piVar8;
          }
          else {
            bVar2 = 0;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool SampleVerifier::verifySampleMipmapLevel (const SampleArguments&	args,
											  const Vec4&				result,
											  const Vec4&				coord,
											  const Vec2&				lodBounds,
											  int						level,
											  std::ostream&				report) const
{
	DE_ASSERT(level < m_imParams.levels);

	VkSamplerMipmapMode mipmapFilter = m_samplerParams.mipmapFilter;

	if (level == m_imParams.levels - 1)
	{
		mipmapFilter = VK_SAMPLER_MIPMAP_MODE_NEAREST;
	}

	Vec3	unnormalizedCoordMin[2];
	Vec3	unnormalizedCoordMax[2];
	IVec3	gridCoordMin[2];
	IVec3	gridCoordMax[2];

	const FloatFormat coordFormat(-32, 32, 16, true);

	calcUnnormalizedCoordRange(coord,
							   m_levels[level].getSize(),
							   coordFormat,
							   unnormalizedCoordMin[0],
							   unnormalizedCoordMax[0]);

	calcTexelGridCoordRange(unnormalizedCoordMin[0],
							unnormalizedCoordMax[0],
							m_coordBits,
							gridCoordMin[0],
							gridCoordMax[0]);

	report << "Level " << level << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[0] << ", " << unnormalizedCoordMax[0] << "]\n";
	report << "Level " << level << " computed texel grid coordinate range: [" << gridCoordMin[0] << ", " << gridCoordMax[0] << "]\n";

	if (mipmapFilter == VK_SAMPLER_MIPMAP_MODE_LINEAR)
	{
		calcUnnormalizedCoordRange(coord,
								   m_levels[level+1].getSize(),
								   coordFormat,
								   unnormalizedCoordMin[1],
								   unnormalizedCoordMax[1]);

		calcTexelGridCoordRange(unnormalizedCoordMin[1],
								unnormalizedCoordMax[1],
								m_coordBits,
								gridCoordMin[1],
								gridCoordMax[1]);


		report << "Level " << level+1 << " computed unnormalized coordinate range: [" << unnormalizedCoordMin[1] << " - " << unnormalizedCoordMax[1] << "]\n";
		report << "Level " << level+1 << " computed texel grid coordinate range: [" << gridCoordMin[1] << " - " << gridCoordMax[1] << "]\n";
	}
	else
	{
		unnormalizedCoordMin[1] = unnormalizedCoordMax[1] = Vec3(0.0f);
		gridCoordMin[1] = gridCoordMax[1] = IVec3(0);
	}

	bool done = false;

	IVec3 gridCoord[2] = {gridCoordMin[0], gridCoordMin[1]};

    while (!done)
	{
		if (verifySampleTexelGridCoords(args, result, gridCoord[0], gridCoord[1], lodBounds, level, mipmapFilter, report))
			return true;

		// Get next grid coordinate to test at

		// Represents whether the increment at a position wraps and should "carry" to the next place
		bool carry = true;

		for (int levelNdx = 0; levelNdx < 2; ++levelNdx)
		{
			for (int compNdx = 0; compNdx < 3; ++compNdx)
			{
				if (carry)
				{
					deInt32& comp = gridCoord[levelNdx][compNdx];
				    ++comp;

					if (comp > gridCoordMax[levelNdx][compNdx])
					{
						comp = gridCoordMin[levelNdx][compNdx];
					}
					else
					{
						carry = false;
					}
				}
			}
		}

		done = carry;
	}

	return false;
}